

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O2

size_t __thiscall
std::hash<duckdb::interval_t>::operator()(hash<duckdb::interval_t> *this,interval_t *val)

{
  int64_t micros;
  int64_t days;
  int64_t months;
  ulong local_30;
  uint local_28 [2];
  uint local_20 [2];
  
  duckdb::interval_t::Normalize(val,(int64_t *)local_20,(int64_t *)local_28,(int64_t *)&local_30);
  return (long)(int)(local_20[0] ^ local_28[0]) ^ local_30;
}

Assistant:

size_t operator()(const duckdb::interval_t &val) const {
		int64_t months, days, micros;
		val.Normalize(months, days, micros);
		using std::hash;

		return hash<int32_t> {}(duckdb::UnsafeNumericCast<int32_t>(days)) ^
		       hash<int32_t> {}(duckdb::UnsafeNumericCast<int32_t>(months)) ^ hash<int64_t> {}(micros);
	}